

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O2

void __thiscall Js::JSONStringifier::ReadData(JSONStringifier *this,Var value,JSONProperty *prop)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  charcount_t rhs;
  uint32 uVar4;
  BOOL BVar5;
  RecyclableObject *pRVar6;
  undefined4 *puVar7;
  JavascriptString *ptr;
  double value_00;
  
  bVar3 = VarIs<Js::RecyclableObject>(value);
  if ((bVar3) &&
     (pRVar6 = UnsafeVarTo<Js::RecyclableObject>(value), pRVar6 != (RecyclableObject *)0x0)) {
    ReadData(this,pRVar6,prop);
    return;
  }
  if (value == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00a3d261;
    *puVar7 = 0;
  }
  bVar3 = TaggedInt::Is(value);
  if (bVar3) {
LAB_00a3d0ae:
    prop->type = Number;
    Memory::WriteBarrierPtr<void>::WriteBarrierSet(&(prop->field_1).numericValue.value,value);
    ptr = ScriptContext::GetIntegerString(this->scriptContext,value);
    Memory::WriteBarrierPtr<Js::JavascriptString>::WriteBarrierSet
              (&(prop->field_1).numericValue.string,ptr);
    uVar4 = this->totalStringLength;
    rhs = JavascriptString::GetLength((prop->field_1).numericValue.string.ptr);
    uVar4 = UInt32Math::Add(uVar4,rhs);
    this->totalStringLength = uVar4;
    return;
  }
  if ((ulong)value >> 0x32 == 0) {
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(value);
    if (pRVar6 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00a3d261;
      *puVar7 = 0;
    }
    TVar1 = ((pRVar6->type).ptr)->typeId;
    if ((0x57 < (int)TVar1) && (BVar5 = RecyclableObject::IsExternal(pRVar6), BVar5 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) goto LAB_00a3d261;
      *puVar7 = 0;
    }
    if (TVar1 != TypeIds_Number) {
      if (TVar1 != TypeIds_FirstNumberType) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONStringifier.cpp"
                                    ,0x328,"((0))","(0)");
        if (bVar3) {
          *puVar7 = 0;
          prop->type = Undefined;
          return;
        }
LAB_00a3d261:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      goto LAB_00a3d0ae;
    }
  }
  value_00 = JavascriptNumber::GetValue(value);
  SetNumericProperty(this,value_00,value,prop);
  return;
}

Assistant:

void
JSONStringifier::ReadData(_In_ Var value, _Out_ JSONProperty* prop)
{
    RecyclableObject* valueObj = JavascriptOperators::TryFromVar<RecyclableObject>(value);
    if (valueObj != nullptr)
    {
        ReadData(valueObj, prop);
        return;
    }

    // If value isn't a RecyclableObject, it must be a tagged number

    TypeId typeId = JavascriptOperators::GetTypeId(value);
    switch (typeId)
    {
    case TypeIds_Integer:
    {
        prop->type = JSONContentType::Number;
        prop->numericValue.value = value;
        prop->numericValue.string = this->scriptContext->GetIntegerString(value);
        this->totalStringLength = UInt32Math::Add(this->totalStringLength, prop->numericValue.string->GetLength());
        return;
    }
#if FLOATVAR
    case TypeIds_Number:
        this->SetNumericProperty(JavascriptNumber::GetValue(value), value, prop);
        return;
#endif
    default:
        Assume(UNREACHED);
        prop->type = JSONContentType::Undefined;
        return;
    }
}